

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O2

void __thiscall TPZShapeData::TPZShapeData(TPZShapeData *this)

{
  *(undefined ***)this = &PTR__TPZShapeData_016ec608;
  this->fShapeType = EEmpty;
  TPZManVector<long,_8>::TPZManVector(&this->fCornerNodeIds,0);
  TPZManVector<int,_27>::TPZManVector(&this->fH1ConnectOrders,0);
  TPZManVector<int,_27>::TPZManVector(&this->fH1NumConnectShape,0);
  TPZManVector<TPZTransform<double>,_20>::TPZManVector(&this->fSideTransforms,0);
  TPZManVector<int,_20>::TPZManVector(&this->fSideTransformationId,0);
  TPZFNMatrix<60,_double>::TPZFNMatrix(&this->fPhi);
  TPZFNMatrix<180,_double>::TPZFNMatrix(&this->fDPhi);
  TPZManVector<int,_27>::TPZManVector(&this->fHDivConnectOrders,0);
  TPZManVector<int,_27>::TPZManVector(&this->fHDivNumConnectShape,0);
  TPZManVector<int,_20>::TPZManVector(&this->fSideOrient,0);
  TPZFNMatrix<243,_double>::TPZFNMatrix(&this->fMasterDirections);
  TPZManVector<std::pair<int,_long>,_60>::TPZManVector(&this->fSDVecShapeIndex,0);
  return;
}

Assistant:

TPZShapeData::TPZShapeData() :
    TPZRegisterClassId(&TPZShapeData::ClassId)
{

}